

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int FinalizeSkipProba(VP8Encoder *enc)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = (long)enc->mb_h * (long)enc->mb_w;
  if ((int)uVar6 == 0) {
    (enc->proba).skip_proba = 0xff;
    (enc->proba).use_skip_proba = 0;
    iVar5 = 0x100;
  }
  else {
    iVar1 = (enc->proba).nb_skip;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (uVar6 - (long)iVar1) * 0xff;
    (enc->proba).skip_proba = SUB161(auVar3 / auVar2,0);
    uVar4 = SUB164(auVar3 / auVar2,0);
    iVar5 = 0x100;
    bVar7 = (uVar4 & 0xfe) < 0xfa;
    (enc->proba).use_skip_proba = (uint)bVar7;
    if (bVar7) {
      uVar4 = uVar4 & 0xff;
      iVar5 = (uint)VP8EntropyCost[uVar4 ^ 0xff] * iVar1 +
              (uint)VP8EntropyCost[uVar4] * ((int)uVar6 - iVar1) + 0x900;
    }
  }
  return iVar5;
}

Assistant:

static int FinalizeSkipProba(VP8Encoder* const enc) {
  VP8EncProba* const proba = &enc->proba;
  const int nb_mbs = enc->mb_w * enc->mb_h;
  const int nb_events = proba->nb_skip;
  int size;
  proba->skip_proba = CalcSkipProba(nb_events, nb_mbs);
  proba->use_skip_proba = (proba->skip_proba < SKIP_PROBA_THRESHOLD);
  size = 256;   // 'use_skip_proba' bit
  if (proba->use_skip_proba) {
    size +=  nb_events * VP8BitCost(1, proba->skip_proba)
         + (nb_mbs - nb_events) * VP8BitCost(0, proba->skip_proba);
    size += 8 * 256;   // cost of signaling the 'skip_proba' itself.
  }
  return size;
}